

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool test10(void)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  unsigned_long __tmp_2;
  unsigned_long __tmp_1;
  int *__tmp;
  vector<int> v2;
  vector<int> w2;
  vector<int> local_78;
  vector<int> local_60;
  vector<int> local_48;
  vector<int> local_30;
  
  CP::vector<int>::vector(&local_60);
  CP::vector<int>::vector(&local_78);
  for (local_48.mData._0_4_ = 0; (int)local_48.mData < 500000;
      local_48.mData._0_4_ = (int)local_48.mData + 1) {
    CP::vector<int>::push_back(&local_60,(int *)&local_48);
  }
  for (iVar3 = 0; iVar3 != -400000; iVar3 = iVar3 + -2) {
    local_48.mData._0_4_ = iVar3;
    CP::vector<int>::push_back(&local_78,(int *)&local_48);
  }
  CP::vector<int>::erase(&local_60,local_60.mData);
  CP::vector<int>::erase(&local_60,local_60.mData + 10);
  CP::vector<int>::erase(&local_78,local_78.mData);
  CP::vector<int>::erase(&local_78,local_78.mData + 100);
  CP::vector<int>::vector(&local_48,&local_60);
  CP::vector<int>::vector(&local_30,&local_78);
  iVar3 = 0x186a2;
  do {
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  bVar1 = CP::vector<int>::operator==(&local_60,&local_30);
  if (bVar1) {
    bVar1 = CP::vector<int>::operator==(&local_78,&local_48);
    bVar2 = true;
    if (bVar1) goto LAB_00102060;
  }
  bVar2 = false;
LAB_00102060:
  CP::vector<int>::~vector(&local_30);
  CP::vector<int>::~vector(&local_48);
  CP::vector<int>::~vector(&local_78);
  CP::vector<int>::~vector(&local_60);
  return bVar2;
}

Assistant:

bool test10() {
  CP::vector<int> v;
  CP::vector<int> w;
  int n1 = 500000;
  int n2 = 200000;
  for (int i = 0;i < n1;i++) v.push_back(i);
  for (int i = 0;i < n2;i++) w.push_back(-i*2);
  v.erase(v.begin());
  v.erase(v.begin()+10);
  w.erase(w.begin());
  w.erase(w.begin()+100);

  CP::vector<int> v2(v);
  CP::vector<int> w2(w);
  for (int i = 0;i < 100001;i++)
    v.swap(w);
  if (v == w2 && w == v2) return true;
  return false;
}